

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

bool embree::operator==(Token *a,Token *b)

{
  int *in_RSI;
  int *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  bool local_1;
  
  if (*in_RDI == *in_RSI) {
    if (*in_RDI == 1) {
      local_1 = (char)in_RDI[1] == (char)in_RSI[1];
    }
    else if (*in_RDI == 2) {
      local_1 = in_RDI[1] == in_RSI[1];
    }
    else if (*in_RDI == 3) {
      local_1 = (float)in_RDI[1] == (float)in_RSI[1];
    }
    else if (*in_RDI == 4) {
      local_1 = std::operator==(in_stack_00000010,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a);
    }
    else if (*in_RDI == 5) {
      local_1 = std::operator==(in_stack_00000010,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a);
    }
    else if (*in_RDI == 6) {
      local_1 = std::operator==(in_stack_00000010,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a);
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator==(const Token& a, const Token& b)
    {
      if (a.ty != b.ty) return false;
      if (a.ty == TY_CHAR) return a.c == b.c;
      if (a.ty == TY_INT) return a.i == b.i;
      if (a.ty == TY_FLOAT) return a.f == b.f;
      if (a.ty == TY_IDENTIFIER) return a.str == b.str;
      if (a.ty == TY_STRING) return a.str == b.str;
      if (a.ty == TY_SYMBOL) return a.str == b.str;
      return true;
    }